

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_scalar_txt(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *separator,char *filename)

{
  REF_NODE ref_node;
  uint uVar1;
  FILE *__stream;
  
  ref_node = ref_grid->node;
  uVar1 = ref_node_synchronize_globals(ref_node);
  if (uVar1 == 0) {
    if (ref_grid->mpi->id == 0) {
      __stream = fopen(filename,"w");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xbd7,"ref_gather_scalar_txt","unable to open file");
        return 2;
      }
    }
    else {
      __stream = (FILE *)0x0;
    }
    uVar1 = ref_gather_node_scalar_txt(ref_node,ldim,scalar,separator,0,(FILE *)__stream);
    if (uVar1 == 0) {
      uVar1 = 0;
      if (ref_grid->mpi->id == 0) {
        fclose(__stream);
        uVar1 = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xbdc,"ref_gather_scalar_txt",(ulong)uVar1,"nodes");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xbd1,
           "ref_gather_scalar_txt",(ulong)uVar1,"sync");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_txt(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char *separator,
                                                const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
  }

  RSS(ref_gather_node_scalar_txt(ref_node, ldim, scalar, separator, REF_FALSE,
                                 file),
      "nodes");

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}